

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubD * __thiscall ON_SubDMesh::SubD(ON_SubD *__return_storage_ptr__,ON_SubDMesh *this)

{
  element_type *subd_limple;
  ON_SubDMeshImpl *impl;
  ON_SubDMesh *this_local;
  ON_SubD *subd;
  
  subd_limple = std::__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2> *)this);
  if (subd_limple == (element_type *)0x0) {
    ON_SubD::ON_SubD(__return_storage_ptr__,&ON_SubD::Empty);
  }
  else {
    ON_SubD::ON_SubD(__return_storage_ptr__);
    ON_SubD::ShareDimple(__return_storage_ptr__,subd_limple);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubD ON_SubDMesh::SubD() const
{
  const ON_SubDMeshImpl* impl = m_impl_sp.get();
  if ( nullptr == impl )
    return ON_SubD::Empty;
  ON_SubD subd;
  subd.ShareDimple(*impl);
  return subd;
}